

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

void do_section(int *ip)

{
  int *ip_local;
  
  if ((proc_ptr == (t_proc *)0x0) || (optype != 3)) {
    if (section != optype) {
      section_bank[section] = bank;
      bank_glabl[section][bank] = glablptr;
      bank_loccnt[section][bank] = loccnt;
      bank_page[section][bank] = page;
      section = optype;
      bank = section_bank[optype];
      page = bank_page[optype][bank];
      loccnt = bank_loccnt[optype][bank];
      glablptr = bank_glabl[optype][bank];
    }
    if (pass == 1) {
      loadlc(loccnt + page * 0x2000,1);
      println();
    }
  }
  else {
    fatal_error("No data segment in procs!");
  }
  return;
}

Assistant:

void
do_section(int *ip)
{
    (void)ip;
	if (proc_ptr) {
		if (optype == S_DATA) {
			fatal_error("No data segment in procs!");
			return;
		}
	}
	if (section != optype) {
		/* backup current section data */
		section_bank[section] = bank;
		bank_glabl[section][bank] = glablptr;
		bank_loccnt[section][bank] = loccnt;
		bank_page[section][bank] = page;

		/* change section */
		section = optype;

		/* switch to the new section */
		bank = section_bank[section];
		page = bank_page[section][bank];
		loccnt = bank_loccnt[section][bank];
		glablptr = bank_glabl[section][bank];
	}

	/* output line */
	if (pass == LAST_PASS) {
		loadlc(loccnt + (page << 13), 1);
		println();
	}
}